

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_Surface::IsCone(ON_Surface *this,ON_Cone *cone,double tolerance)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint p_01;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar9;
  long lVar10;
  ON_Plane *pOVar11;
  ON_Plane *pOVar12;
  ON_Cone *pOVar13;
  byte bVar14;
  void *memblock;
  byte bVar15;
  ulong uVar16;
  double extraout_XMM0_Qa;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ulong in_XMM0_Qb;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  ON_Line line;
  ON_3dPoint P;
  ON_Arc arc;
  double local_240;
  double local_228;
  ON_Line local_1f8;
  ON_3dPoint local_1c8;
  void *local_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  long local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ON_3dVector local_170;
  ON_Cone local_158;
  ON_Plane local_c8;
  undefined8 local_48;
  double local_40;
  double dStack_38;
  ON_Curve *pOVar8;
  
  bVar15 = 0;
  bVar3 = ON_IsValid(tolerance);
  uVar22 = (undefined4)in_XMM0_Qb;
  uVar24 = (undefined4)(in_XMM0_Qb >> 0x20);
  dVar17 = tolerance;
  if (!bVar3) {
    dVar17 = 2.3283064365386963e-10;
    uVar22 = 0;
    uVar24 = 0;
  }
  uVar16 = (ulong)dVar17 & -(ulong)(0.0 < tolerance);
  uVar21 = (undefined4)uVar16;
  uVar23 = (undefined4)(uVar16 >> 0x20);
  uVar2 = CONCAT44(uVar24,uVar22) & in_XMM0_Qb;
  auVar25._0_8_ = ~-(ulong)(0.0 < tolerance) & 0x3df0000000000000;
  auVar25._8_8_ = 0;
  auVar1._8_4_ = (int)uVar2;
  auVar1._0_8_ = uVar16;
  auVar1._12_4_ = (int)(uVar2 >> 0x20);
  auVar25 = auVar25 | auVar1;
  bVar3 = ON_Object::IsKindOf((ON_Object *)this,&ON_RevSurface::m_ON_RevSurface_class_rtti);
  local_228 = auVar25._0_8_;
  if (bVar3) {
    bVar3 = ON_RevSurface::IsConical((ON_RevSurface *)this,cone,local_228);
    return bVar3;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.origin.y = (double)CONCAT44(uVar23,uVar21);
  ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,0);
  pOVar8 = (ON_Curve *)CONCAT44(extraout_var,iVar5);
  if (pOVar8 == (ON_Curve *)0x0) {
    return false;
  }
  pOVar11 = &ON_Plane::World_xy;
  pOVar12 = &local_c8;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pOVar12->origin).x = (pOVar11->origin).x;
    pOVar11 = (ON_Plane *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  local_48 = 0x3ff0000000000000;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  ON_Line::ON_Line(&local_1f8);
  uVar22 = auVar25._0_4_;
  uVar24 = auVar25._4_4_;
  uVar16 = -(ulong)(2.3283064365386963e-10 < local_228) & (ulong)local_228;
  iVar5 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar8,0,&local_c8);
  bVar4 = (byte)iVar5;
  if ((bVar4 == 0) &&
     (iVar5 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(uVar16,pOVar8),
     (char)iVar5 != '\0')) {
    ON_Curve::PointAtStart((ON_3dPoint *)&local_158,pOVar8);
    local_1f8.from.z = local_158.plane.origin.z;
    local_1f8.from.x = local_158.plane.origin.x;
    local_1f8.from.y = local_158.plane.origin.y;
    ON_Curve::PointAtEnd((ON_3dPoint *)&local_158,pOVar8);
    local_1f8.to.z = local_158.plane.origin.z;
    local_1f8.to.x = local_158.plane.origin.x;
    local_1f8.to.y = local_158.plane.origin.y;
    bVar14 = 1;
  }
  else {
    bVar14 = 0;
  }
  (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar8);
  if ((bVar4 | bVar14) == 1) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_158.plane.origin.y = (double)CONCAT44(uVar24,uVar22);
    local_158.plane.origin.x = extraout_XMM0_Qa;
    ON_Interval::Mid((ON_Interval *)&local_158);
    iVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,1);
    pOVar8 = (ON_Curve *)CONCAT44(extraout_var_00,iVar5);
    if (pOVar8 != (ON_Curve *)0x0) {
      if (bVar4 == 0) {
        iVar5 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                          (uVar16,pOVar8,0,&local_c8);
        bVar4 = (byte)iVar5;
      }
      else {
        bVar4 = 1;
        if (bVar14 == 0) {
          iVar5 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                            (uVar16,pOVar8);
          if ((char)iVar5 == '\0') {
            bVar14 = 0;
            goto LAB_005a25f0;
          }
          ON_Curve::PointAtStart((ON_3dPoint *)&local_158,pOVar8);
          local_1f8.from.z = local_158.plane.origin.z;
          local_1f8.from.x = local_158.plane.origin.x;
          local_1f8.from.y = local_158.plane.origin.y;
          ON_Curve::PointAtEnd((ON_3dPoint *)&local_158,pOVar8);
          local_1f8.to.z = local_158.plane.origin.z;
          local_1f8.to.x = local_158.plane.origin.x;
          local_1f8.to.y = local_158.plane.origin.y;
        }
        bVar14 = 1;
      }
LAB_005a25f0:
      (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar8);
      if ((bVar4 & bVar14) == 1) {
        p.y = local_1f8.from.y;
        p.x = local_1f8.from.x;
        p.z = local_1f8.from.z;
        ON_Plane::ClosestPointTo((ON_3dPoint *)&local_158,&local_c8,p);
        dVar17 = ON_3dPoint::DistanceTo(&local_c8.origin,(ON_3dPoint *)&local_158);
        p_00.y = local_1f8.to.y;
        p_00.x = local_1f8.to.x;
        p_00.z = local_1f8.to.z;
        ON_Plane::ClosestPointTo((ON_3dPoint *)&local_158,&local_c8,p_00);
        dVar18 = ON_3dPoint::DistanceTo(&local_c8.origin,(ON_3dPoint *)&local_158);
        if (2.3283064365386963e-10 < ABS(dVar17 - dVar18)) {
          P_00.y = local_1f8.from.y;
          P_00.x = local_1f8.from.x;
          P_00.z = local_1f8.from.z;
          dVar19 = ON_PlaneEquation::ValueAt(&local_c8.plane_equation,P_00);
          P_01.y = local_1f8.to.y;
          P_01.x = local_1f8.to.x;
          P_01.z = local_1f8.to.z;
          local_240 = ON_PlaneEquation::ValueAt(&local_c8.plane_equation,P_01);
          if (2.3283064365386963e-10 < ABS(dVar19 - local_240)) {
            ON_Cone::ON_Cone(&local_158);
            local_158.height = (dVar19 * dVar18 - local_240 * dVar17) / (dVar18 - dVar17);
            bVar3 = ON_IsValid(local_158.height);
            dVar20 = local_158.height;
            if ((!bVar3) || (ABS(local_158.height) <= 2.3283064365386963e-10)) {
LAB_005a2983:
              bVar3 = false;
            }
            else {
              pOVar11 = &local_c8;
              pOVar13 = &local_158;
              for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pOVar13->plane).origin.x = (pOVar11->origin).x;
                pOVar11 = (ON_Plane *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
                pOVar13 = (ON_Cone *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
              }
              ::operator*(&local_170,dVar20,&local_158.plane.zaxis);
              ON_3dPoint::operator+(&local_1c8,(ON_3dPoint *)&local_158,&local_170);
              local_158.plane.origin.z = local_1c8.z;
              local_158.plane.origin.x = local_1c8.x;
              local_158.plane.origin.y = local_1c8.y;
              ON_Plane::UpdateEquation(&local_158.plane);
              if (dVar18 <= dVar17) {
                local_240 = dVar19;
              }
              local_158.radius =
                   (double)(~-(ulong)(dVar17 < dVar18) & (ulong)dVar17 |
                           -(ulong)(dVar17 < dVar18) & (ulong)dVar18);
              local_158.height = local_240 - local_158.height;
              bVar3 = ON_Cone::IsValid(&local_158);
              dVar19 = local_158.height;
              if (!bVar3) goto LAB_005a2983;
              P_02.y = local_1f8.from.y;
              P_02.x = local_1f8.from.x;
              P_02.z = local_1f8.from.z;
              dVar20 = ON_PlaneEquation::ValueAt(&local_158.plane.plane_equation,P_02);
              local_1a8 = (dVar17 + dVar18) * 7.450580596925e-09;
              dVar19 = ABS(dVar19) * local_1a8;
              if ((dVar19 < ABS(local_158.height * dVar17 - dVar20 * local_158.radius)) ||
                 (P_03.y = local_1f8.to.y, P_03.x = local_1f8.to.x, P_03.z = local_1f8.to.z,
                 dVar17 = ON_PlaneEquation::ValueAt(&local_158.plane.plane_equation,P_03),
                 dVar19 < ABS(local_158.height * dVar18 - dVar17 * local_158.radius)))
              goto LAB_005a2983;
              uVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
              uVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
              pvVar9 = onmalloc((long)(int)(uVar6 + uVar7 + 2) << 3);
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,pvVar9);
              lVar10 = (long)(int)uVar6 * 8;
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
              if ((int)uVar6 < 1) {
                bVar3 = true;
                memblock = pvVar9;
              }
              else {
                if (local_228 <= local_1a8) {
                  local_228 = local_1a8;
                }
                local_1a8 = ABS(local_158.height) * local_228;
                uStack_1a0 = 0;
                local_198 = (ulong)uVar6;
                uVar16 = 0;
                bVar3 = false;
                local_1b0 = pvVar9;
                local_190 = (long)(int)uVar6;
                local_188 = (ulong)uVar7;
                local_178 = (ulong)uVar7;
                do {
                  uVar6 = (uint)(uVar16 != 0);
                  local_180 = uVar16;
                  do {
                    dVar17 = *(double *)((long)local_1b0 + local_180 * 8 + 8);
                    dVar18 = *(double *)((long)local_1b0 + local_180 * 8);
                    if (0 < (int)local_188) {
                      uVar16 = 0;
                      do {
                        uVar7 = (uint)(uVar16 != 0);
                        iVar5 = 4 - (uint)(uVar16 != 0);
                        do {
                          PointAt((ON_3dPoint *)&local_170,this,
                                  ((double)(int)(4 - uVar6) * dVar18 + (double)(int)uVar6 * dVar17)
                                  * 0.25,((double)iVar5 *
                                          *(double *)((long)pvVar9 + uVar16 * 8 + lVar10 + 8) +
                                         (double)(int)uVar7 *
                                         *(double *)((long)pvVar9 + uVar16 * 8 + lVar10 + 0x10)) *
                                         0.25);
                          local_1c8.z = local_170.z;
                          local_1c8.x = local_170.x;
                          local_1c8.y = local_170.y;
                          P_04.y = local_170.y;
                          P_04.x = local_170.x;
                          P_04.z = local_170.z;
                          dVar19 = ON_PlaneEquation::ValueAt(&local_158.plane.plane_equation,P_04);
                          p_01.y = local_1c8.y;
                          p_01.x = local_1c8.x;
                          p_01.z = local_1c8.z;
                          ON_Plane::ClosestPointTo((ON_3dPoint *)&local_170,&local_158.plane,p_01);
                          dVar20 = ON_3dPoint::DistanceTo
                                             ((ON_3dPoint *)&local_158,(ON_3dPoint *)&local_170);
                          if (local_1a8 < ABS(dVar20 * local_158.height - dVar19 * local_158.radius)
                             ) {
                            onfree(local_1b0);
                            goto LAB_005a2985;
                          }
                          uVar7 = uVar7 + 1;
                          iVar5 = iVar5 + -1;
                        } while (uVar7 != 5);
                        uVar16 = uVar16 + 1;
                      } while (uVar16 != local_178);
                    }
                    uVar6 = uVar6 + 1;
                  } while (uVar6 != 5);
                  uVar16 = local_180 + 1;
                  bVar3 = local_190 <= (long)uVar16;
                  memblock = local_1b0;
                } while (uVar16 != local_198);
              }
              onfree(memblock);
              if (cone != (ON_Cone *)0x0) {
                memcpy(cone,&local_158,0x90);
              }
            }
LAB_005a2985:
            ON_Cone::~ON_Cone(&local_158);
            goto LAB_005a2996;
          }
        }
      }
    }
  }
  bVar3 = false;
LAB_005a2996:
  ON_Line::~ON_Line(&local_1f8);
  ON_Plane::~ON_Plane(&local_c8);
  return bVar3;
}

Assistant:

bool ON_Surface::IsCone( ON_Cone* cone, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsConical(cone,tolerance) ? true : false;
  }


  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc;
  ON_Line line;
  int bIsLine = 0;
  int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  if ( !bIsArc )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc && !bIsLine )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  if ( !bIsArc )
    bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  else if ( !bIsLine )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc || !bIsLine )
    return false;

  double r0 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
  double r1 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
  if ( fabs(r0-r1) <= ON_ZERO_TOLERANCE )
    return false;
  double h0 = arc.plane.plane_equation.ValueAt(line.from);
  double h1 = arc.plane.plane_equation.ValueAt(line.to);
  if ( fabs(h0-h1) <= ON_ZERO_TOLERANCE )
    return false;
  double tol = 0.5*ON_SQRT_EPSILON*(r0+r1);

  ON_Cone cn;
  cn.height = (h0*r1 - r0*h1)/(r1-r0);
  if ( !ON_IsValid(cn.height) || fabs(cn.height) <= ON_ZERO_TOLERANCE )
    return false;
  cn.plane = arc.plane;
  cn.plane.origin = cn.plane.origin + cn.height*cn.plane.zaxis;
  cn.plane.UpdateEquation();
  if ( r0 >= r1 )
  {
    cn.radius = r0;
    cn.height = h0-cn.height;
  }
  else
  {
    cn.radius = r1;
    cn.height = h1-cn.height;
  }
  if ( !cn.IsValid() )
    return false;
  tol *= fabs(cn.height);

  // if (r - h*cn.radius/cn.height > tolerance) return false;
  double h = cn.plane.plane_equation.ValueAt(line.from);
  if ( fabs(r0*cn.height - h*cn.radius) > tol )
    return false;
  h = cn.plane.plane_equation.ValueAt(line.to);
  if ( fabs(r1*cn.height - h*cn.radius) > tol )
    return false;

  ON_3dPoint P;
  double u, v, r;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  tol = 0.5*ON_SQRT_EPSILON*(r0+r1);
  if ( tol < tolerance )
    tol = tolerance;
  tol *= fabs(cn.height);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          h = cn.plane.plane_equation.ValueAt(P);
          r = cn.plane.origin.DistanceTo(cn.plane.ClosestPointTo(P));
          // if (r - h*cn.radius/cn.height > tolerance) return false;
          if ( fabs(r*cn.height - h*cn.radius) > tol )
          {
            onfree(s);
            return false;
          }
        }
      }
    }
  }
  onfree(s);

  if ( cone )
  {
    *cone = cn;
  }

  return true;
}